

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O1

void __thiscall geemuboi::test::core::CpuTest_ld_mhl_b_Test::TestBody(CpuTest_ld_mhl_b_Test *this)

{
  FunctionMocker<void_(unsigned_short,_unsigned_char)> *this_00;
  bool bVar1;
  int iVar2;
  _func_int *message;
  Registers expected_regs;
  AssertionResult gtest_ar;
  AssertHelper local_90;
  Matcher<unsigned_char> local_88;
  Matcher<unsigned_short> local_70;
  MockSpec<void_(unsigned_short,_unsigned_char)> local_58;
  
  (this->super_CpuTest).regs.f = 0xf0;
  (this->super_CpuTest).regs.b = 0xfe;
  (this->super_CpuTest).regs.h = '3';
  (this->super_CpuTest).regs.l = 'D';
  testing::Matcher<unsigned_short>::Matcher(&local_70,0x3344);
  testing::Matcher<unsigned_char>::Matcher(&local_88,(this->super_CpuTest).regs.b);
  this_00 = &(this->super_CpuTest).mmu.gmock2_write_byte_12;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_00,&(this->super_CpuTest).mmu);
  testing::internal::FunctionMocker<void_(unsigned_short,_unsigned_char)>::With
            (&local_58,this_00,&local_70,&local_88);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
            (&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
             ,0x708,"mmu","write_byte(make_addr(regs.h, regs.l), regs.b)");
  local_58.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>.
  super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
  super_MatcherBase<unsigned_short>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001addc8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::
  ~linked_ptr(&local_58.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>
               .super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
               super_MatcherBase<unsigned_short>.impl_);
  local_58.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>.
  super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>.
  super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001ae0b8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_char_&>_>::
  ~linked_ptr(&local_58.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>
               .super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>.
               super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
               super_MatcherBase<unsigned_char>.impl_);
  local_88.super_MatcherBase<unsigned_char>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001ae0b8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_char_&>_>::
  ~linked_ptr(&local_88.super_MatcherBase<unsigned_char>.impl_);
  local_70.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001addc8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::
  ~linked_ptr(&local_70.super_MatcherBase<unsigned_short>.impl_);
  CpuTest::execute_instruction(&this->super_CpuTest,'p');
  local_70.super_MatcherBase<unsigned_short>._vptr_MatcherBase = (_func_int **)0xf04433000000fe00;
  local_70.super_MatcherBase<unsigned_short>.impl_.value_._0_2_ = 1;
  local_70.super_MatcherBase<unsigned_short>.impl_.value_._2_2_ = 0;
  CpuTest::verify_state_changes(&this->super_CpuTest,(Registers *)&local_70);
  iVar2 = (*((this->super_CpuTest).cpu._M_t.
             super___uniq_ptr_impl<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>
             ._M_t.
             super__Tuple_impl<0UL,_geemuboi::core::ICpu_*,_std::default_delete<geemuboi::core::ICpu>_>
             .super__Head_base<0UL,_geemuboi::core::ICpu_*,_false>._M_head_impl)->_vptr_ICpu[1])();
  local_88.super_MatcherBase<unsigned_char>._vptr_MatcherBase =
       (_func_int **)
       CONCAT44(local_88.super_MatcherBase<unsigned_char>._vptr_MatcherBase._4_4_,iVar2);
  local_90.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_58,"cpu->get_cycles_executed()","2",(uint *)&local_88,
             (int *)&local_90);
  if ((char)local_58.function_mocker_ == '\0') {
    testing::Message::Message((Message *)&local_88);
    if (local_58.matchers_.
        super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>.
        super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>.
        super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
        super_MatcherBase<unsigned_char>._vptr_MatcherBase == (_func_int **)0x0) {
      message = (_func_int *)0x182e84;
    }
    else {
      message = *local_58.matchers_.
                 super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>
                 .super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>.
                 super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
                 super_MatcherBase<unsigned_char>._vptr_MatcherBase;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0x713,(char *)message);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.super_MatcherBase<unsigned_char>._vptr_MatcherBase != (_func_int **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_88.super_MatcherBase<unsigned_char>._vptr_MatcherBase != (_func_int **)0x0)) {
        (**(code **)(*local_88.super_MatcherBase<unsigned_char>._vptr_MatcherBase + 8))();
      }
      local_88.super_MatcherBase<unsigned_char>._vptr_MatcherBase = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58.matchers_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(CpuTest, ld_mhl_b) {
    regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;

    regs.b = 0xFE;
    regs.h = 0x33;
    regs.l = 0x44;

    EXPECT_CALL(mmu, write_byte(make_addr(regs.h, regs.l), regs.b));
    execute_instruction(0x70);

    ICpu::Registers expected_regs{};
    expected_regs.b = 0xFE;
    expected_regs.h = 0x33;
    expected_regs.l = 0x44;
    expected_regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}